

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadjointcheckpointscheme_fixed.c
# Opt level: O0

SUNErrCode
SUNAdjointCheckpointScheme_InsertVector_Fixed
          (SUNAdjointCheckpointScheme self,suncountertype step_num,suncountertype stage_num,
          sunrealtype t,N_Vector y)

{
  char *__ptr;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  SUNDataNode solution_node;
  char *key;
  SUNDataNode step_data_node;
  SUNContext sunctx_local_scope_;
  undefined8 local_48;
  int64_t in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  long local_10;
  long local_8;
  
  local_30 = *(undefined8 *)(in_RDI + 0x10);
  local_38 = 0;
  local_28 = in_RCX;
  local_20 = in_XMM0_Qa;
  local_8 = in_RDI;
  if (in_RSI == *(long *)(*(long *)(in_RDI + 8) + 0x10)) {
    local_38 = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x30);
  }
  else {
    local_10 = in_RSI;
    SUNDataNode_CreateList(*(undefined4 *)(*(long *)(in_RDI + 8) + 0x40),0,local_30,&local_38);
    *(undefined8 *)(*(long *)(local_8 + 8) + 0x30) = local_38;
    *(long *)(*(long *)(local_8 + 8) + 0x10) = local_10;
    __ptr = sunSignedToString(in_stack_ffffffffffffffc0);
    SUNDataNode_AddNamedChild(*(undefined8 *)(*(long *)(local_8 + 8) + 0x28),__ptr,local_38);
    free(__ptr);
  }
  local_48 = 0;
  SUNDataNode_CreateLeaf
            (*(undefined4 *)(*(long *)(local_8 + 8) + 0x40),
             *(undefined8 *)(*(long *)(local_8 + 8) + 0x20),local_30,&local_48);
  SUNDataNode_SetDataNvector(local_20,local_48,local_28);
  SUNDataNode_AddChild(local_38,local_48);
  return 0;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_InsertVector_Fixed(
  SUNAdjointCheckpointScheme self, suncountertype step_num,
  SUNDIALS_MAYBE_UNUSED suncountertype stage_num, sunrealtype t, N_Vector y)
{
  SUNFunctionBegin(self->sunctx);

  /* If this is the first state for a step, then we need to create a
     list node first to store the step and all stage solutions in.
     We keep a pointer to the list node until this step is over for
     fast access when inserting stages. */
  SUNDataNode step_data_node = NULL;
  if (step_num != IMPL_MEMBER(self, step_num_of_current_insert))
  {
    SUNCheckCall(SUNDataNode_CreateList(IMPL_MEMBER(self, io_mode), 0, SUNCTX_,
                                        &step_data_node));
    IMPL_MEMBER(self, current_insert_step_node)   = step_data_node;
    IMPL_MEMBER(self, step_num_of_current_insert) = step_num;

    /* Store the step node in the root node object. */
    char* key = sunSignedToString(step_num);
    SUNLogExtraDebug(SUNCTX_->logger, "insert-new-step",
                     "step_num = %d, key = %s", step_num, key);
    SUNCheckCall(SUNDataNode_AddNamedChild(IMPL_MEMBER(self, root_node), key,
                                           step_data_node));
    free(key);
  }
  else { step_data_node = IMPL_MEMBER(self, current_insert_step_node); }

  /* Add the state data as a leaf node in the step node's list of children. */
  SUNDataNode solution_node = NULL;
  SUNCheckCall(SUNDataNode_CreateLeaf(IMPL_MEMBER(self, io_mode),
                                      IMPL_MEMBER(self, mem_helper), SUNCTX_,
                                      &solution_node));
  SUNCheckCall(SUNDataNode_SetDataNvector(solution_node, y, t));

  SUNLogExtraDebug(SUNCTX_->logger, "insert-stage",
                   "step_num = %d, stage_num = %d, t = %g", step_num, stage_num,
                   t);
  SUNCheckCall(SUNDataNode_AddChild(step_data_node, solution_node));

  return SUN_SUCCESS;
}